

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cornellbox.cpp
# Opt level: O1

void __thiscall CornellBox::_calculateGeometry(CornellBox *this)

{
  mat4 *ltw;
  vector<Triangle_*,_std::allocator<Triangle_*>_> *this_00;
  Triangle *pTVar1;
  Triangle *local_230;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_224;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_218;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_20c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_200;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1f4;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1e8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1dc;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1d0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1c4;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1b8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1ac;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1a0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_194;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_188;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_17c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_170;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_164;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_158;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_14c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_140;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_134;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_128;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_11c;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_110;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_104;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_f8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_ec;
  ColorRGB local_e0;
  ColorRGB local_d0;
  ColorRGB local_c0;
  ColorRGB local_b0;
  ColorRGB local_a0;
  ColorRGB local_90;
  ColorRGB local_80;
  ColorRGB local_70;
  ColorRGB local_60;
  ColorRGB local_50;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_44;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_38;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_2c;
  
  *(undefined8 *)&(this->v0).field_0 = 0;
  *(undefined8 *)((long)&(this->v0).field_0 + 8) = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->v1).field_0 + 4) = 0x3f80000000000000;
  *(undefined8 *)&(this->v2).field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->v2).field_0 + 8) = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->v3).field_0 + 4) = 0x3f8000003f800000;
  *(undefined8 *)&(this->v4).field_0 = 0;
  *(undefined8 *)((long)&(this->v4).field_0 + 8) = 0x3f800000c0000000;
  *(undefined8 *)((long)&(this->v5).field_0 + 4) = 0xc000000000000000;
  *(undefined8 *)&(this->v6).field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->v6).field_0 + 8) = 0x3f800000c0000000;
  *(undefined8 *)((long)&(this->v7).field_0 + 4) = 0xc00000003f800000;
  *(undefined8 *)&(this->l0).field_0 = 0x3f7d70a43ecccccd;
  *(undefined8 *)((long)&(this->l0).field_0 + 8) = 0x3f19999abf666666;
  *(undefined8 *)((long)&(this->l1).field_0 + 4) = 0xbf6666663f7d70a4;
  *(undefined8 *)&(this->l2).field_0 = 0x3f7d70a43ecccccd;
  *(undefined8 *)((long)&(this->l2).field_0 + 8) = 0x3f19999abf8ccccd;
  *(undefined8 *)((long)&(this->l3).field_0 + 4) = 0xbf8ccccd3f7d70a4;
  pTVar1 = (Triangle *)operator_new(0x60);
  local_2c._0_8_ = 0;
  local_2c.field_0.z = 1.0;
  local_38._0_8_ = 0;
  local_38.field_0.z = -2.0;
  local_44._0_8_ = 0x3f800000;
  local_44.field_0.z = 1.0;
  ColorRGB::ColorRGB(&local_50,0.5,0.5,0.4);
  ltw = &(this->super_SceneObject).localToWorld;
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_2c.field_0,(vec3 *)&local_38.field_0,
                     (vec3 *)&local_44.field_0,local_50);
  this_00 = &this->triangles;
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_ec.field_0.x = (this->v1).field_0.field_0.x;
  local_ec.field_0.y = (this->v1).field_0.field_0.y;
  local_ec.field_0.z = (this->v1).field_0.field_0.z;
  local_f8.field_0.x = (this->v4).field_0.field_0.x;
  local_f8.field_0.y = (this->v4).field_0.field_0.y;
  local_f8.field_0.z = (this->v4).field_0.field_0.z;
  local_104.field_0.x = (this->v5).field_0.field_0.x;
  local_104.field_0.y = (this->v5).field_0.field_0.y;
  local_104.field_0.z = (this->v5).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_60,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_ec.field_0,(vec3 *)&local_f8.field_0,
                     (vec3 *)&local_104.field_0,local_60);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_110.field_0.x = (this->v0).field_0.field_0.x;
  local_110.field_0.y = (this->v0).field_0.field_0.y;
  local_110.field_0.z = (this->v0).field_0.field_0.z;
  local_11c.field_0.x = (this->v2).field_0.field_0.x;
  local_11c.field_0.y = (this->v2).field_0.field_0.y;
  local_11c.field_0.z = (this->v2).field_0.field_0.z;
  local_128.field_0.x = (this->v4).field_0.field_0.x;
  local_128.field_0.y = (this->v4).field_0.field_0.y;
  local_128.field_0.z = (this->v4).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_70,1.0,0.0,0.0);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_110.field_0,(vec3 *)&local_11c.field_0,
                     (vec3 *)&local_128.field_0,local_70);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_134.field_0.x = (this->v2).field_0.field_0.x;
  local_134.field_0.y = (this->v2).field_0.field_0.y;
  local_134.field_0.z = (this->v2).field_0.field_0.z;
  local_140.field_0.x = (this->v6).field_0.field_0.x;
  local_140.field_0.y = (this->v6).field_0.field_0.y;
  local_140.field_0.z = (this->v6).field_0.field_0.z;
  local_14c.field_0.x = (this->v4).field_0.field_0.x;
  local_14c.field_0.y = (this->v4).field_0.field_0.y;
  local_14c.field_0.z = (this->v4).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_80,1.0,0.0,0.0);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_134.field_0,(vec3 *)&local_140.field_0,
                     (vec3 *)&local_14c.field_0,local_80);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_158.field_0.x = (this->v1).field_0.field_0.x;
  local_158.field_0.y = (this->v1).field_0.field_0.y;
  local_158.field_0.z = (this->v1).field_0.field_0.z;
  local_164.field_0.x = (this->v5).field_0.field_0.x;
  local_164.field_0.y = (this->v5).field_0.field_0.y;
  local_164.field_0.z = (this->v5).field_0.field_0.z;
  local_170.field_0.x = (this->v3).field_0.field_0.x;
  local_170.field_0.y = (this->v3).field_0.field_0.y;
  local_170.field_0.z = (this->v3).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_90,0.0,1.0,0.0);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_158.field_0,(vec3 *)&local_164.field_0,
                     (vec3 *)&local_170.field_0,local_90);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_17c.field_0.x = (this->v3).field_0.field_0.x;
  local_17c.field_0.y = (this->v3).field_0.field_0.y;
  local_17c.field_0.z = (this->v3).field_0.field_0.z;
  local_188.field_0.x = (this->v5).field_0.field_0.x;
  local_188.field_0.y = (this->v5).field_0.field_0.y;
  local_188.field_0.z = (this->v5).field_0.field_0.z;
  local_194.field_0.x = (this->v7).field_0.field_0.x;
  local_194.field_0.y = (this->v7).field_0.field_0.y;
  local_194.field_0.z = (this->v7).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_a0,0.0,1.0,0.0);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_17c.field_0,(vec3 *)&local_188.field_0,
                     (vec3 *)&local_194.field_0,local_a0);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_1a0.field_0.x = (this->v2).field_0.field_0.x;
  local_1a0.field_0.y = (this->v2).field_0.field_0.y;
  local_1a0.field_0.z = (this->v2).field_0.field_0.z;
  local_1ac.field_0.x = (this->v3).field_0.field_0.x;
  local_1ac.field_0.y = (this->v3).field_0.field_0.y;
  local_1ac.field_0.z = (this->v3).field_0.field_0.z;
  local_1b8.field_0.x = (this->v6).field_0.field_0.x;
  local_1b8.field_0.y = (this->v6).field_0.field_0.y;
  local_1b8.field_0.z = (this->v6).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_b0,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_1a0.field_0,(vec3 *)&local_1ac.field_0,
                     (vec3 *)&local_1b8.field_0,local_b0);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_1c4.field_0.x = (this->v3).field_0.field_0.x;
  local_1c4.field_0.y = (this->v3).field_0.field_0.y;
  local_1c4.field_0.z = (this->v3).field_0.field_0.z;
  local_1d0.field_0.x = (this->v7).field_0.field_0.x;
  local_1d0.field_0.y = (this->v7).field_0.field_0.y;
  local_1d0.field_0.z = (this->v7).field_0.field_0.z;
  local_1dc.field_0.x = (this->v6).field_0.field_0.x;
  local_1dc.field_0.y = (this->v6).field_0.field_0.y;
  local_1dc.field_0.z = (this->v6).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_c0,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_1c4.field_0,(vec3 *)&local_1d0.field_0,
                     (vec3 *)&local_1dc.field_0,local_c0);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_1e8.field_0.x = (this->v4).field_0.field_0.x;
  local_1e8.field_0.y = (this->v4).field_0.field_0.y;
  local_1e8.field_0.z = (this->v4).field_0.field_0.z;
  local_1f4.field_0.x = (this->v6).field_0.field_0.x;
  local_1f4.field_0.y = (this->v6).field_0.field_0.y;
  local_1f4.field_0.z = (this->v6).field_0.field_0.z;
  local_200.field_0.x = (this->v5).field_0.field_0.x;
  local_200.field_0.y = (this->v5).field_0.field_0.y;
  local_200.field_0.z = (this->v5).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_d0,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_1e8.field_0,(vec3 *)&local_1f4.field_0,
                     (vec3 *)&local_200.field_0,local_d0);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  pTVar1 = (Triangle *)operator_new(0x60);
  local_20c.field_0.x = (this->v5).field_0.field_0.x;
  local_20c.field_0.y = (this->v5).field_0.field_0.y;
  local_20c.field_0.z = (this->v5).field_0.field_0.z;
  local_218.field_0.x = (this->v6).field_0.field_0.x;
  local_218.field_0.y = (this->v6).field_0.field_0.y;
  local_218.field_0.z = (this->v6).field_0.field_0.z;
  local_224.field_0.x = (this->v7).field_0.field_0.x;
  local_224.field_0.y = (this->v7).field_0.field_0.y;
  local_224.field_0.z = (this->v7).field_0.field_0.z;
  ColorRGB::ColorRGB(&local_e0,0.5,0.5,0.4);
  Triangle::Triangle(pTVar1,ltw,(vec3 *)&local_20c.field_0,(vec3 *)&local_218.field_0,
                     (vec3 *)&local_224.field_0,local_e0);
  local_230 = pTVar1;
  std::vector<Triangle*,std::allocator<Triangle*>>::emplace_back<Triangle*>
            ((vector<Triangle*,std::allocator<Triangle*>> *)this_00,&local_230);
  return;
}

Assistant:

void CornellBox::_calculateGeometry() {
    
    v0 = glm::vec3(0, 0, 1);
    v1 = glm::vec3(1, 0, 1);
    v2 = glm::vec3(0, 1, 1);
    v3 = glm::vec3(1, 1, 1);
    v4 = glm::vec3(0, 0, -2);
    v5 = glm::vec3(1, 0, -2);
    v6 = glm::vec3(0, 1, -2);
    v7 = glm::vec3(1, 1, -2);
    
    l0 = glm::vec3(0.4, 0.99, -0.9);
    l1 = glm::vec3(0.6, 0.99, -0.9);
    l2 = glm::vec3(0.4, 0.99, -1.1);
    l3 = glm::vec3(0.6, 0.99, -1.1);
    
    //bottom
    triangles.push_back(new Triangle(localToWorld, v0, v4, v1, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v1, v4, v5, ColorRGB(0.5, 0.5, 0.4)));
    
    //left
    triangles.push_back(new Triangle(localToWorld, v0, v2, v4, ColorRGB(1.0, 0.0, 0.0)));
    triangles.push_back(new Triangle(localToWorld, v2, v6, v4, ColorRGB(1.0, 0.0, 0.0)));
    
    //right
    triangles.push_back(new Triangle(localToWorld, v1, v5, v3, ColorRGB(0.0, 1.0, 0.0)));
    triangles.push_back(new Triangle(localToWorld, v3, v5, v7, ColorRGB(0.0, 1.0, 0.0)));
    
    //top
    triangles.push_back(new Triangle(localToWorld, v2, v3, v6, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v3, v7, v6, ColorRGB(0.5, 0.5, 0.4)));
    
    //back
    triangles.push_back(new Triangle(localToWorld, v4, v6, v5, ColorRGB(0.5, 0.5, 0.4)));
    triangles.push_back(new Triangle(localToWorld, v5, v6, v7, ColorRGB(0.5, 0.5, 0.4)));
    
    //light
//     triangles.push_back(new Triangle(localToWorld, l0, l2, l1, ColorRGB(1.0, 1.0, 1.0)));
//     triangles.push_back(new Triangle(localToWorld, l1, l2, l3, ColorRGB(1.0, 1.0, 1.0)));
}